

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,Camera *camera)

{
  undefined1 auVar1 [16];
  Point3<float> p;
  Point3<float> p_00;
  Vector3<float> c;
  Vector3<float> c_00;
  Vector3<float> c_01;
  Vector3<float> c_02;
  Vector3<float> v;
  Vector3<float> v_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Vector3<float> v_05;
  CameraSample sample_00;
  undefined1 auVar2 [16];
  Vector3f v_06;
  Vector3<float> v_07;
  Vector3<float> v_08;
  Vector3<float> v_09;
  Vector3<float> v_10;
  Vector3<float> v_11;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vector3f z;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f v_12;
  Vector3f v_13;
  Vector3f v_14;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  int iVar18;
  CameraRayDifferential *pCVar19;
  long in_RDI;
  float fVar20;
  type tVar21;
  type tVar22;
  undefined8 uVar23;
  Vector3<float> VVar24;
  Vector3f VVar25;
  Tuple3<pbrt::Vector3,_float> TVar26;
  Tuple3<pbrt::Vector3,_float> TVar27;
  Tuple3<pbrt::Vector3,_float> TVar28;
  Vector3f dyf;
  Vector3f dxf;
  Vector3f df;
  Frame f;
  Vector3f doy;
  Vector3f dox;
  RayDifferential *ray;
  optional<pbrt::CameraRayDifferential> crd;
  int i;
  int n;
  SampledWavelengths lambda;
  CameraSample sample;
  Film *in_stack_fffffffffffff7b8;
  CameraSample *in_stack_fffffffffffff7c0;
  Tuple3<pbrt::Vector3,_float> *this_00;
  undefined4 in_stack_fffffffffffff7d0;
  float in_stack_fffffffffffff7d4;
  undefined8 in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  float in_stack_fffffffffffff7e8;
  type in_stack_fffffffffffff7ec;
  type in_stack_fffffffffffff7f0;
  float in_stack_fffffffffffff7f4;
  undefined8 in_stack_fffffffffffff7f8;
  Vector3<float> *args_1;
  Vector3<float> *in_stack_fffffffffffff800;
  char *in_stack_fffffffffffff808;
  float in_stack_fffffffffffff810;
  float in_stack_fffffffffffff814;
  undefined8 in_stack_fffffffffffff818;
  undefined4 uStack_7e0;
  LogLevel in_stack_fffffffffffff824;
  undefined8 in_stack_fffffffffffff878;
  float in_stack_fffffffffffff880;
  undefined4 uStack_77c;
  Frame *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8b4;
  float in_stack_fffffffffffff8b8;
  optional local_f0 [124];
  Tuple2<pbrt::Point2,_int> local_74;
  Tuple2<pbrt::Point2,_int> local_6c;
  int local_64;
  int local_60;
  undefined8 local_3c;
  float local_34;
  float fStack_30;
  undefined8 uStack_2c;
  undefined4 local_24;
  undefined4 uStack_20;
  undefined8 local_1c;
  undefined4 local_14;
  
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff7c0,
             (float)((ulong)in_stack_fffffffffffff7b8 >> 0x20),SUB84(in_stack_fffffffffffff7b8,0),
             0.0);
  *(undefined8 *)(in_RDI + 0x374) = local_1c;
  *(undefined4 *)(in_RDI + 0x37c) = local_14;
  *(undefined8 *)(in_RDI + 0x368) = *(undefined8 *)(in_RDI + 0x374);
  *(undefined4 *)(in_RDI + 0x370) = *(undefined4 *)(in_RDI + 0x37c);
  *(undefined8 *)(in_RDI + 0x35c) = *(undefined8 *)(in_RDI + 0x368);
  *(undefined4 *)(in_RDI + 0x364) = *(undefined4 *)(in_RDI + 0x370);
  *(undefined8 *)(in_RDI + 0x350) = *(undefined8 *)(in_RDI + 0x35c);
  *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 0x364);
  CameraSample::CameraSample(in_stack_fffffffffffff7c0);
  Point2<float>::Point2
            (&in_stack_fffffffffffff7c0->pFilm,(float)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
             SUB84(in_stack_fffffffffffff7b8,0));
  uStack_2c = local_3c;
  local_24 = 0x3f000000;
  SampledWavelengths::SampleVisible(in_stack_fffffffffffff7d4);
  TVar26.z = in_stack_fffffffffffff814;
  TVar26.x = (float)(int)in_stack_fffffffffffff818;
  TVar26.y = (float)(int)((ulong)in_stack_fffffffffffff818 >> 0x20);
  TVar27.z = in_stack_fffffffffffff7f4;
  TVar27.x = (float)(int)in_stack_fffffffffffff7f8;
  TVar27.y = (float)(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  TVar28.z = in_stack_fffffffffffff7d4;
  TVar28.x = (float)(int)in_stack_fffffffffffff7d8;
  TVar28.y = (float)(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  local_60 = 0x200;
  local_64 = 0;
  while( true ) {
    args_1 = TVar27._0_8_;
    if (local_60 <= local_64) break;
    fVar20 = (float)local_64;
    iVar18 = local_60 + -1;
    local_6c = (Tuple2<pbrt::Point2,_int>)Film::FullResolution(in_stack_fffffffffffff7b8);
    local_34 = (fVar20 / (float)iVar18) * (float)local_6c.x;
    fVar20 = (float)local_64;
    iVar18 = local_60 + -1;
    local_74 = (Tuple2<pbrt::Point2,_int>)Film::FullResolution(in_stack_fffffffffffff7b8);
    fStack_30 = (fVar20 / (float)iVar18) * (float)local_74.y;
    this_00 = (Tuple3<pbrt::Vector3,_float> *)CONCAT44(uStack_20,local_24);
    in_stack_fffffffffffff7b8 = (Film *)CONCAT44(fStack_30,local_34);
    sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y = TVar27.z;
    sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff7f0;
    sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)TVar27._0_8_;
    sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)TVar27._0_8_ >> 0x20);
    sample_00._16_8_ = in_stack_fffffffffffff800;
    Camera::GenerateRayDifferential
              (TVar28._0_8_,sample_00,
               (SampledWavelengths *)CONCAT44(TVar28.z,in_stack_fffffffffffff7d0));
    bVar17 = pstd::optional::operator_cast_to_bool(local_f0);
    if (bVar17) {
      pCVar19 = pstd::optional<pbrt::CameraRayDifferential>::operator->
                          ((optional<pbrt::CameraRayDifferential> *)0x8a786a);
      uVar23 = 0;
      p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7e8;
      p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff7e0;
      p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20)
      ;
      VVar24 = Point3<float>::operator-((Point3<float> *)this_00,p);
      auVar16._8_8_ = uVar23;
      auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar16);
      uVar23 = 0;
      VVar25.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar25 = CameraFromRender((CameraBase *)CONCAT44(TVar27.z,in_stack_fffffffffffff7f0),VVar25,
                                in_stack_fffffffffffff7ec);
      auVar15._8_8_ = uVar23;
      auVar15._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar15);
      VVar24.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar21 = Length<float>(VVar24);
      v.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar22 = Length<float>(v);
      if (tVar21 < tVar22) {
        *(undefined8 *)(in_RDI + 0x350) = uVar23;
        *(float *)(in_RDI + 0x358) = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      uVar23 = 0;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7e8;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff7e0;
      p_00.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
      VVar24 = Point3<float>::operator-((Point3<float> *)this_00,p_00);
      auVar14._8_8_ = uVar23;
      auVar14._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar14);
      uVar23 = 0;
      v_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar25 = CameraFromRender((CameraBase *)CONCAT44(TVar27.z,in_stack_fffffffffffff7f0),v_06,
                                in_stack_fffffffffffff7ec);
      auVar13._8_8_ = uVar23;
      auVar13._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar13);
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar21 = Length<float>(v_00);
      v_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar22 = Length<float>(v_01);
      if (tVar21 < tVar22) {
        *(undefined8 *)(in_RDI + 0x35c) = uVar23;
        *(float *)(in_RDI + 0x364) = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      uVar23 = 0;
      v_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_07.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar24 = Normalize<float>(v_07);
      auVar12._8_8_ = uVar23;
      auVar12._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar12);
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      uVar23 = 0;
      v_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar24 = Normalize<float>(v_08);
      auVar11._8_8_ = uVar23;
      auVar11._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar11);
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      uVar23 = 0;
      v_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar24 = Normalize<float>(v_09);
      auVar10._8_8_ = uVar23;
      auVar10._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar10);
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      z.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff880;
      z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff878;
      z.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff878 >> 0x20);
      Frame::FromZ(z);
      uVar23 = 0;
      v_12.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff8b4;
      v_12.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff8b0;
      v_12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff8b8;
      VVar25 = Frame::ToLocal(in_stack_fffffffffffff898,v_12);
      auVar9._8_8_ = uVar23;
      auVar9._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar9);
      uVar23 = 0;
      v_13.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff8b4;
      v_13.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff8b0;
      v_13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff8b8;
      VVar25 = Frame::ToLocal(in_stack_fffffffffffff898,v_13);
      in_stack_fffffffffffff8b4 = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
      in_stack_fffffffffffff8b8 = VVar25.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar8._8_8_ = uVar23;
      auVar8._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar8);
      uVar23 = 0;
      v_10.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar24 = Normalize<float>(v_10);
      in_stack_fffffffffffff898 = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_8_ = uVar23;
      auVar7._0_8_ = in_stack_fffffffffffff898;
      vmovlpd_avx(auVar7);
      uVar23 = 0;
      v_14.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff8b4;
      v_14.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff8b0;
      v_14.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff8b8;
      VVar25 = Frame::ToLocal(in_stack_fffffffffffff898,v_14);
      in_stack_fffffffffffff878 = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      in_stack_fffffffffffff880 = (float)uVar23;
      uStack_77c = (undefined4)((ulong)uVar23 >> 0x20);
      auVar6._8_4_ = in_stack_fffffffffffff880;
      auVar6._0_8_ = in_stack_fffffffffffff878;
      auVar6._12_4_ = uStack_77c;
      vmovlpd_avx(auVar6);
      uVar23 = 0;
      v_11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
      v_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff808;
      VVar24 = Normalize<float>(v_11);
      auVar5._8_8_ = uVar23;
      auVar5._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar5);
      uVar23 = 0;
      c.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7e8;
      c.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff7e0;
      c.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
      VVar24 = Tuple3<pbrt::Vector3,float>::operator-(this_00,c);
      auVar4._8_8_ = uVar23;
      auVar4._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar4);
      v_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar21 = Length<float>(v_02);
      v_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      tVar22 = Length<float>(v_03);
      uVar23 = in_stack_fffffffffffff7e0;
      if (tVar21 < tVar22) {
        uVar23 = 0;
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7e8;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff7e0;
        c_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
        TVar26 = (Tuple3<pbrt::Vector3,_float>)Tuple3<pbrt::Vector3,float>::operator-(this_00,c_00);
        uStack_7e0 = (undefined4)uVar23;
        in_stack_fffffffffffff824 = (LogLevel)((ulong)uVar23 >> 0x20);
        auVar3._8_4_ = uStack_7e0;
        auVar3._0_8_ = TVar26._0_8_;
        auVar3._12_4_ = in_stack_fffffffffffff824;
        uVar23 = vmovlpd_avx(auVar3);
        *(undefined8 *)(in_RDI + 0x368) = uVar23;
        *(float *)(in_RDI + 0x370) = TVar26.z;
        uVar23 = in_stack_fffffffffffff7e0;
      }
      in_stack_fffffffffffff800 = (Vector3<float> *)0x0;
      c_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7e8;
      c_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      c_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar23 >> 0x20);
      TVar27 = (Tuple3<pbrt::Vector3,_float>)Tuple3<pbrt::Vector3,float>::operator-(this_00,c_01);
      auVar2._8_8_ = in_stack_fffffffffffff800;
      auVar2._0_8_ = TVar27._0_8_;
      vmovlpd_avx(auVar2);
      v_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      in_stack_fffffffffffff7f0 = Length<float>(v_04);
      v_05.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7ec;
      v_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7e8;
      v_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
      in_stack_fffffffffffff7ec = Length<float>(v_05);
      in_stack_fffffffffffff7e0 = uVar23;
      if (in_stack_fffffffffffff7f0 < in_stack_fffffffffffff7ec) {
        in_stack_fffffffffffff7e0 = 0;
        c_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7e8;
        c_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
        c_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar23 >> 0x20);
        TVar28 = (Tuple3<pbrt::Vector3,_float>)Tuple3<pbrt::Vector3,float>::operator-(this_00,c_02);
        auVar1._8_8_ = in_stack_fffffffffffff7e0;
        auVar1._0_8_ = TVar28._0_8_;
        uVar23 = vmovlpd_avx(auVar1);
        *(undefined8 *)(in_RDI + 0x374) = uVar23;
        *(float *)(in_RDI + 0x37c) = TVar28.z;
      }
    }
    pstd::optional<pbrt::CameraRayDifferential>::~optional
              ((optional<pbrt::CameraRayDifferential> *)0x8a875b);
    local_64 = local_64 + 1;
  }
  if (logging::logLevel < 1) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              (in_stack_fffffffffffff824,TVar26._0_8_,(int)TVar26.z,in_stack_fffffffffffff808,
               in_stack_fffffffffffff800,args_1);
    args_1 = TVar27._0_8_;
  }
  if (logging::logLevel < 1) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              (in_stack_fffffffffffff824,TVar26._0_8_,(int)TVar26.z,in_stack_fffffffffffff808,
               in_stack_fffffffffffff800,args_1);
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(Camera camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleVisible(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}